

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::do_udp(Server *this)

{
  int iVar1;
  __pid_t __val;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  sockaddr_un name;
  
  iVar1 = socket(1,0x802,0);
  this->udp_fd = iVar1;
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0xbd);
    pcVar2 = "this->udp_fd";
  }
  else {
    name.sun_family = 1;
    __val = getpid();
    std::__cxx11::to_string(&local_c0,__val);
    std::operator+(&local_e0,"/tmp/webed_",&local_c0);
    std::operator+(&local_a0,&local_e0,".sock");
    strcpy(name.sun_path,local_a0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    iVar1 = bind(this->udp_fd,(sockaddr *)&name,0x6e);
    if (-1 < iVar1) {
      return;
    }
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0xc3);
    pcVar2 = "bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un))";
  }
  fprintf(_stderr,"--> %s\n",pcVar2);
  perror("info");
  exit(1);
}

Assistant:

void Server::do_udp() {
    this->udp_fd = socket(AF_UNIX, SOCK_DGRAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->udp_fd);

    struct sockaddr_un name;

    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
    IF_NEGATIVE_EXIT(bind(this->udp_fd, (struct sockaddr *) &name, sizeof(struct sockaddr_un)));
}